

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_sockfd.c
# Opt level: O0

int nni_sfd_conn_alloc(nni_sfd_conn **cp,int fd)

{
  nni_sfd_conn *arg;
  nni_sfd_conn *c;
  int fd_local;
  nni_sfd_conn **cp_local;
  
  arg = (nni_sfd_conn *)nni_zalloc(0xe0);
  if (arg == (nni_sfd_conn *)0x0) {
    cp_local._4_4_ = 2;
  }
  else {
    nni_posix_pfd_init(&arg->pfd,fd,sfd_cb,arg);
    arg->closed = false;
    arg->fd = fd;
    nni_mtx_init(&arg->mtx);
    nni_aio_list_init(&arg->readq);
    nni_aio_list_init(&arg->writeq);
    (arg->stream).s_free = sfd_free;
    (arg->stream).s_close = sfd_close;
    (arg->stream).s_stop = sfd_stop;
    (arg->stream).s_recv = sfd_recv;
    (arg->stream).s_send = sfd_send;
    (arg->stream).s_get = sfd_get;
    (arg->stream).s_set = sfd_set;
    *cp = arg;
    cp_local._4_4_ = 0;
  }
  return cp_local._4_4_;
}

Assistant:

int
nni_sfd_conn_alloc(nni_sfd_conn **cp, int fd)
{
	nni_sfd_conn *c;
	if ((c = NNI_ALLOC_STRUCT(c)) == NULL) {
		return (NNG_ENOMEM);
	}
	nni_posix_pfd_init(&c->pfd, fd, sfd_cb, c);

	c->closed = false;
	c->fd     = fd;

	nni_mtx_init(&c->mtx);
	nni_aio_list_init(&c->readq);
	nni_aio_list_init(&c->writeq);

	c->stream.s_free  = sfd_free;
	c->stream.s_close = sfd_close;
	c->stream.s_stop  = sfd_stop;
	c->stream.s_recv  = sfd_recv;
	c->stream.s_send  = sfd_send;
	c->stream.s_get   = sfd_get;
	c->stream.s_set   = sfd_set;

	*cp = c;
	return (0);
}